

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O1

void __thiscall
Corrade::Utility::Configuration::save
          (Configuration *this,ostream *out,string *eol,ConfigurationGroup *group,string *fullPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  pointer pcVar3;
  size_type sVar4;
  byte *pbVar5;
  long lVar6;
  pointer pGVar7;
  size_t __n;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long *plVar11;
  undefined8 *puVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ostream *output;
  long *plVar14;
  size_type *psVar15;
  char cVar16;
  _Alloc_hider _Var17;
  pointer pVVar18;
  pointer pGVar19;
  long lVar20;
  __string_type __str_2;
  string valueString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  ulong local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [40];
  ConfigurationGroup *local_b8;
  ostream *local_b0;
  string *local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  Configuration *local_60;
  pointer local_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_b0 = out;
  local_a8 = fullPath;
  local_60 = this;
  if (group->_configuration != this) {
    output = Error::defaultOutput();
    Error::Error((Error *)local_e0,output,(Flags)0x0);
    Debug::operator<<((Debug *)local_e0,
                      "Assertion group->configuration() == this failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Configuration.cpp:312"
                     );
    Error::~Error((Error *)local_e0);
    abort();
  }
  local_e0._0_8_ = local_e0 + 0x10;
  local_e0[8] = '\0';
  local_e0[9] = '\0';
  local_e0[10] = '\0';
  local_e0[0xb] = Black;
  local_e0._12_4_ = 0;
  local_e0[0x10] = 0;
  pVVar18 = (group->_values).
            super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (group->_values).
             super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = group;
  if (pVVar18 != local_58) {
    paVar1 = &local_120.field_2;
    do {
      if ((pVVar18->key)._M_string_length == 0) {
        std::operator+(&local_120,&pVVar18->value,eol);
        std::__cxx11::string::operator=((string *)local_e0,(string *)&local_120);
LAB_0011745a:
        _Var17._M_p = local_120._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != paVar1) {
LAB_00117464:
          operator_delete(_Var17._M_p);
        }
      }
      else {
        lVar9 = std::__cxx11::string::find((char)&pVVar18->value,10);
        if (lVar9 != -1) {
          pcVar3 = (pVVar18->value)._M_dataplus._M_p;
          local_120._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_120,pcVar3,pcVar3 + (pVVar18->value)._M_string_length);
          cVar16 = (char)&local_120;
          uVar10 = std::__cxx11::string::find(cVar16,10);
          while (uVar10 != 0xffffffffffffffff) {
            std::__cxx11::string::replace
                      ((ulong)&local_120,uVar10,(char *)0x1,(ulong)(eol->_M_dataplus)._M_p);
            uVar10 = std::__cxx11::string::find(cVar16,10);
          }
          local_80[0] = local_70;
          pcVar3 = (pVVar18->key)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_80,pcVar3,pcVar3 + (pVVar18->key)._M_string_length);
          std::__cxx11::string::append((char *)local_80);
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)local_80,(ulong)(eol->_M_dataplus)._M_p);
          plVar14 = plVar11 + 2;
          if ((long *)*plVar11 == plVar14) {
            local_40 = *plVar14;
            lStack_38 = plVar11[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *plVar14;
            local_50 = (long *)*plVar11;
          }
          local_48 = plVar11[1];
          *plVar11 = (long)plVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_50,(ulong)local_120._M_dataplus._M_p);
          local_a0 = &local_90;
          plVar14 = plVar11 + 2;
          if ((long *)*plVar11 == plVar14) {
            local_90 = *plVar14;
            lStack_88 = plVar11[3];
          }
          else {
            local_90 = *plVar14;
            local_a0 = (long *)*plVar11;
          }
          local_98 = plVar11[1];
          *plVar11 = (long)plVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_a0,(ulong)(eol->_M_dataplus)._M_p);
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          psVar15 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_100.field_2._M_allocated_capacity = *psVar15;
            local_100.field_2._8_8_ = puVar12[3];
          }
          else {
            local_100.field_2._M_allocated_capacity = *psVar15;
            local_100._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_100._M_string_length = puVar12[1];
          *puVar12 = psVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
          local_160 = &local_150;
          psVar15 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_150._M_allocated_capacity = *psVar15;
            local_150._8_8_ = puVar12[3];
          }
          else {
            local_150._M_allocated_capacity = *psVar15;
            local_160 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar12;
          }
          local_158 = puVar12[1];
          *puVar12 = psVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_160,(ulong)(eol->_M_dataplus)._M_p);
          plVar14 = plVar11 + 2;
          if ((long *)*plVar11 == plVar14) {
            local_130 = *plVar14;
            lStack_128 = plVar11[3];
            local_140 = &local_130;
          }
          else {
            local_130 = *plVar14;
            local_140 = (long *)*plVar11;
          }
          local_138 = plVar11[1];
          *plVar11 = (long)plVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_e0,(string *)&local_140);
          if (local_140 != &local_130) {
            operator_delete(local_140);
          }
          if (local_160 != &local_150) {
            operator_delete(local_160);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p);
          }
          if (local_a0 != &local_90) {
            operator_delete(local_a0);
          }
          if (local_50 != &local_40) {
            operator_delete(local_50);
          }
          if (local_80[0] != local_70) {
            operator_delete(local_80[0]);
          }
          goto LAB_0011745a;
        }
        sVar4 = (pVVar18->value)._M_string_length;
        if (sVar4 == 0) {
LAB_001175e6:
          local_160 = &local_150;
          pcVar3 = (pVVar18->key)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,pcVar3,pcVar3 + (pVVar18->key)._M_string_length);
          std::__cxx11::string::_M_replace_aux((ulong)&local_160,local_158,0,'\x01');
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_160,(ulong)(pVVar18->value)._M_dataplus._M_p);
          plVar11 = puVar12 + 2;
          if ((long *)*puVar12 == plVar11) {
            local_130 = *plVar11;
            lStack_128 = puVar12[3];
            local_140 = &local_130;
          }
          else {
            local_130 = *plVar11;
            local_140 = (long *)*puVar12;
          }
          local_138 = puVar12[1];
          *puVar12 = plVar11;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_140,(ulong)(eol->_M_dataplus)._M_p);
          psVar15 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_120.field_2._M_allocated_capacity = *psVar15;
            local_120.field_2._8_8_ = puVar12[3];
            local_120._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_120.field_2._M_allocated_capacity = *psVar15;
            local_120._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_120._M_string_length = puVar12[1];
          *puVar12 = psVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_e0,(string *)&local_120);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != paVar1) {
            operator_delete(local_120._M_dataplus._M_p);
          }
          if (local_140 != &local_130) {
            operator_delete(local_140);
          }
          paVar13 = &local_150;
          _Var17._M_p = (pointer)local_160;
        }
        else {
          pbVar5 = (byte *)(pVVar18->value)._M_dataplus._M_p;
          bVar2 = *pbVar5;
          if ((((4 < bVar2 - 9) && (bVar2 != 0x20)) && (bVar2 = pbVar5[sVar4 - 1], 4 < bVar2 - 9))
             && (bVar2 != 0x20)) goto LAB_001175e6;
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          pcVar3 = (pVVar18->key)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_100,pcVar3,pcVar3 + (pVVar18->key)._M_string_length);
          std::__cxx11::string::append((char *)&local_100);
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_100,(ulong)(pVVar18->value)._M_dataplus._M_p);
          local_160 = &local_150;
          psVar15 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_150._M_allocated_capacity = *psVar15;
            local_150._8_8_ = plVar11[3];
          }
          else {
            local_150._M_allocated_capacity = *psVar15;
            local_160 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar11;
          }
          local_158 = plVar11[1];
          *plVar11 = (long)psVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_replace_aux((ulong)&local_160,local_158,0,'\x01');
          plVar11 = puVar12 + 2;
          if ((long *)*puVar12 == plVar11) {
            local_130 = *plVar11;
            lStack_128 = puVar12[3];
            local_140 = &local_130;
          }
          else {
            local_130 = *plVar11;
            local_140 = (long *)*puVar12;
          }
          local_138 = puVar12[1];
          *puVar12 = plVar11;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_140,(ulong)(eol->_M_dataplus)._M_p);
          psVar15 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_120.field_2._M_allocated_capacity = *psVar15;
            local_120.field_2._8_8_ = puVar12[3];
            local_120._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_120.field_2._M_allocated_capacity = *psVar15;
            local_120._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_120._M_string_length = puVar12[1];
          *puVar12 = psVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_e0,(string *)&local_120);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != paVar1) {
            operator_delete(local_120._M_dataplus._M_p);
          }
          if (local_140 != &local_130) {
            operator_delete(local_140);
          }
          if (local_160 != &local_150) {
            operator_delete(local_160);
          }
          paVar13 = &local_100.field_2;
          _Var17._M_p = local_100._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var17._M_p != paVar13) goto LAB_00117464;
      }
      std::ostream::write((char *)local_b0,local_e0._0_8_);
      pVVar18 = pVVar18 + 1;
    } while (pVVar18 != local_58);
  }
  pGVar19 = (local_b8->_groups).
            super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_b8->_groups).
      super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
      ._M_impl.super__Vector_impl_data._M_finish != pGVar19) {
    lVar20 = 0;
    lVar9 = 0;
    do {
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      lVar6 = *(long *)((long)&(pGVar19->name)._M_dataplus._M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,lVar6,
                 *(long *)((long)&(pGVar19->name)._M_string_length + lVar20) + lVar6);
      if (local_a8->_M_string_length != 0) {
        local_160 = &local_150;
        pcVar3 = (local_a8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_160,pcVar3,pcVar3 + local_a8->_M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)&local_160,local_158,0,'\x01');
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_160,(ulong)local_120._M_dataplus._M_p);
        plVar11 = puVar12 + 2;
        if ((long *)*puVar12 == plVar11) {
          local_130 = *plVar11;
          lStack_128 = puVar12[3];
          local_140 = &local_130;
        }
        else {
          local_130 = *plVar11;
          local_140 = (long *)*puVar12;
        }
        local_138 = puVar12[1];
        *puVar12 = plVar11;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_120,(string *)&local_140);
        if (local_140 != &local_130) {
          operator_delete(local_140);
        }
        if (local_160 != &local_150) {
          operator_delete(local_160);
        }
      }
      if (lVar9 == 0) {
LAB_0011786a:
        plVar11 = *(long **)((long)&pGVar19->group + lVar20);
        if ((*plVar11 != plVar11[1]) || (plVar11[3] == plVar11[4])) goto LAB_0011787c;
      }
      else {
        pGVar7 = (local_b8->_groups).
                 super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __n = *(size_t *)((long)pGVar7 + lVar20 + -0x20);
        if ((__n != *(size_t *)((long)&(pGVar19->name)._M_string_length + lVar20)) ||
           ((__n != 0 &&
            (iVar8 = bcmp(*(void **)((long)&pGVar7[-1].name._M_dataplus._M_p + lVar20),
                          *(void **)((long)&(pGVar19->name)._M_dataplus._M_p + lVar20),__n),
            iVar8 != 0)))) goto LAB_0011786a;
LAB_0011787c:
        std::operator+(&local_100,'[',&local_120);
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_replace_aux
                            ((ulong)&local_100,local_100._M_string_length,0,'\x01');
        local_160 = &local_150;
        psVar15 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_150._M_allocated_capacity = *psVar15;
          local_150._8_8_ = puVar12[3];
        }
        else {
          local_150._M_allocated_capacity = *psVar15;
          local_160 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar12;
        }
        local_158 = puVar12[1];
        *puVar12 = psVar15;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&local_160,(ulong)(eol->_M_dataplus)._M_p)
        ;
        plVar11 = puVar12 + 2;
        if ((long *)*puVar12 == plVar11) {
          local_130 = *plVar11;
          lStack_128 = puVar12[3];
          local_140 = &local_130;
        }
        else {
          local_130 = *plVar11;
          local_140 = (long *)*puVar12;
        }
        local_138 = puVar12[1];
        *puVar12 = plVar11;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_e0,(string *)&local_140);
        if (local_140 != &local_130) {
          operator_delete(local_140);
        }
        if (local_160 != &local_150) {
          operator_delete(local_160);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p);
        }
        std::ostream::write((char *)local_b0,local_e0._0_8_);
      }
      save(local_60,local_b0,eol,*(ConfigurationGroup **)((long)&pGVar19->group + lVar20),&local_120
          );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      lVar9 = lVar9 + 1;
      pGVar19 = (local_b8->_groups).
                super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 0x28;
    } while (lVar9 != ((long)(local_b8->_groups).
                             super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar19 >> 3) *
                      -0x3333333333333333);
  }
  if ((ostream *)local_e0._0_8_ != (ostream *)(local_e0 + 0x10)) {
    operator_delete((void *)local_e0._0_8_);
  }
  return;
}

Assistant:

void Configuration::save(std::ostream& out, const std::string& eol, ConfigurationGroup* group, const std::string& fullPath) const {
    CORRADE_INTERNAL_ASSERT(group->configuration() == this);
    std::string buffer;

    /* Foreach all items in the group */
    for(const Value& value: group->_values) {
        /* Key/value pair */
        if(!value.key.empty()) {
            /* Multi-line value */
            if(value.value.find_first_of('\n') != std::string::npos) {
                /* Replace \n with `eol` */
                /** @todo fixme: ugly and slow */
                std::string valueString = value.value;
                std::size_t pos = 0;
                while((pos = valueString.find_first_of('\n', pos)) != std::string::npos) {
                    valueString.replace(pos, 1, eol);
                    pos += eol.size();
                }

                buffer = value.key + "=\"\"\"" + eol + valueString + eol + "\"\"\"" + eol;

            /* Value with leading/trailing spaces */
            } else if(!value.value.empty() && (isWhitespace(value.value.front()) || isWhitespace(value.value.back()))) {
                buffer = value.key + "=\"" + value.value + '"' + eol;

            /* Value without spaces */
            } else buffer = value.key + '=' + value.value + eol;
        }

        /* Comment / empty line */
        else buffer = value.value + eol;

        out.write(buffer.data(), buffer.size());
    }

    /* Recursively process all subgroups */
    for(std::size_t i = 0; i != group->_groups.size(); ++i) {
        const Group& g = group->_groups[i];

        /* Subgroup name */
        std::string name = g.name;
        if(!fullPath.empty()) name = fullPath + '/' + name;

        /* Omit the name if the group is a first subgroup of given name, has no
           values and only subgroups */
        if(!((i == 0 || group->_groups[i - 1].name != g.name) && g.group->_values.empty() && !g.group->_groups.empty())) {
            buffer = '[' + name + ']' + eol;
            out.write(buffer.data(), buffer.size());
        }

        save(out, eol, g.group, name);
    }
}